

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateCEnum
               (EnumDescriptor *desc,Printer *printer)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  FileDescriptor *this;
  FileDescriptor *file;
  string local_1d8;
  EnumValueDescriptor *local_1b8;
  EnumValueDescriptor *value;
  undefined1 local_1a8 [4];
  int i;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  string local_138;
  Options local_118;
  undefined1 local_d8 [8];
  string php_name;
  string local_b0;
  allocator local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string c_name;
  Printer *printer_local;
  EnumDescriptor *desc_local;
  
  c_name.field_2._8_8_ = printer;
  psVar4 = EnumDescriptor::full_name_abi_cxx11_(desc);
  std::__cxx11::string::string((string *)local_38,(string *)psVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,".",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"_",(allocator *)(php_name.field_2._M_local_buf + 0xf));
  StringReplace(&local_58,(string *)local_38,&local_78,&local_b0,true);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(php_name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_118.is_descriptor = false;
  local_118.aggregate_metadata = false;
  local_118.gen_c_wkt = false;
  local_118._3_5_ = 0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl._0_8_ = 0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Options::Options(&local_118);
  FullClassName<google::protobuf::EnumDescriptor>((string *)local_d8,desc,&local_118);
  Options::~Options(&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"\\",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"\\\\",&local_181);
  StringReplace(&local_138,(string *)local_d8,&local_158,&local_180,true);
  std::__cxx11::string::operator=((string *)local_d8,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  uVar1 = c_name.field_2._8_8_;
  psVar4 = EnumDescriptor::full_name_abi_cxx11_(desc);
  this = EnumDescriptor::file(desc);
  (anonymous_namespace)::FilenameCName_abi_cxx11_
            ((string *)local_1a8,(_anonymous_namespace_ *)this,file);
  io::Printer::
  Print<char[5],std::__cxx11::string,char[12],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            ((Printer *)uVar1,
             "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nPHP_METHOD($c_name$, name) {\n  $file_c_name$_AddDescriptor();\n  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n  const char *name;\n  zend_long value;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n      FAILURE) {\n    return;\n  }\n  name = upb_enumdef_iton(e, value);\n  if (!name) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no name \"\n                            \"defined for value \" ZEND_LONG_FMT \".\",\n                            value);\n    return;\n  }\n  RETURN_STRING(name);\n}\n\nPHP_METHOD($c_name$, value) {\n  $file_c_name$_AddDescriptor();\n  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n  char *name = NULL;\n  size_t name_len;\n  int32_t num;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n                            &name_len) == FAILURE) {\n    return;\n  }\n  if (!upb_enumdef_ntoi(e, name, name_len, &num)) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no value \"\n                            \"defined for name %s.\",\n                            name);\n    return;\n  }\n  RETURN_LONG(num);\n}\n\nstatic zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
             ,(char (*) [5])0x77db8d,psVar4,(char (*) [12])"file_c_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [7])0x77c27b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [9])"php_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  std::__cxx11::string::~string((string *)local_1a8);
  value._4_4_ = 0;
  while( true ) {
    iVar3 = value._4_4_;
    iVar2 = EnumDescriptor::value_count(desc);
    if (iVar2 <= iVar3) break;
    local_1b8 = EnumDescriptor::value(desc,value._4_4_);
    uVar1 = c_name.field_2._8_8_;
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_1b8);
    iVar3 = EnumValueDescriptor::number(local_1b8);
    std::__cxx11::to_string(&local_1d8,iVar3);
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[4],std::__cxx11::string>
              ((Printer *)uVar1,
               "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n                                   strlen(\"$name$\"), $num$);\n"
               ,(char (*) [7])0x77c27b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [5])0x77db8d,psVar4,(char (*) [4])0x778734,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    value._4_4_ = value._4_4_ + 1;
  }
  io::Printer::Print<>((Printer *)c_name.field_2._8_8_,"}\n\n");
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenerateCEnum(const EnumDescriptor* desc, io::Printer* printer) {
  std::string c_name = desc->full_name();
  c_name = StringReplace(c_name, ".", "_", true);
  std::string php_name = FullClassName(desc, Options());
  php_name = StringReplace(php_name, "\\", "\\\\", true);
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "PHP_METHOD($c_name$, name) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n"
      "  const char *name;\n"
      "  zend_long value;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n"
      "      FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  name = upb_enumdef_iton(e, value);\n"
      "  if (!name) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no name \"\n"
      "                            \"defined for value \" ZEND_LONG_FMT \".\",\n"
      "                            value);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_STRING(name);\n"
      "}\n"
      "\n"
      "PHP_METHOD($c_name$, value) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n"
      "  char *name = NULL;\n"
      "  size_t name_len;\n"
      "  int32_t num;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n"
      "                            &name_len) == FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  if (!upb_enumdef_ntoi(e, name, name_len, &num)) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no value \"\n"
      "                            \"defined for name %s.\",\n"
      "                            name);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_LONG(num);\n"
      "}\n"
      "\n"
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n"
      "  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n"
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n",
      "name", desc->full_name(),
      "file_c_name", FilenameCName(desc->file()),
      "c_name", c_name,
      "php_name", php_name);

  for (int i = 0; i < desc->value_count(); i++) {
    const EnumValueDescriptor* value = desc->value(i);
    printer->Print(
        "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n"
        "                                   strlen(\"$name$\"), $num$);\n",
        "c_name", c_name,
        "name", value->name(),
        "num", std::to_string(value->number()));
  }

  printer->Print(
      "}\n"
      "\n");
}